

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O3

int ecx_FOEread(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int *psize,void *p
               ,int timeout)

{
  int iVar1;
  uint32 uVar2;
  uint8 uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  undefined6 in_register_00000032;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  short local_858;
  uint local_838;
  uint8 local_834;
  byte local_833;
  uint8 local_832;
  uint32 local_830;
  undefined1 local_82c [1012];
  int local_438;
  byte local_433;
  uint8 local_432;
  uint32 local_430;
  undefined1 local_42c [1020];
  
  iVar1 = *psize;
  ec_clearmbx((ec_mbxbuft *)&local_438);
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_438,0);
  ec_clearmbx((ec_mbxbuft *)&local_838);
  sVar6 = strlen(filename);
  uVar7 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar8 = context->slavelist[uVar7].mbx_l - 0xc;
  uVar5 = (uint)sVar6;
  if ((uVar8 & 0xffff) < ((uint)sVar6 & 0xffff)) {
    uVar5 = uVar8;
  }
  local_838 = (uint)(ushort)((short)uVar5 + 6);
  local_834 = '\0';
  uVar3 = ec_nextmbxcnt(context->slavelist[uVar7].mbx_cnt);
  context->slavelist[uVar7].mbx_cnt = uVar3;
  local_833 = uVar3 << 4 | 4;
  local_832 = '\x01';
  local_830 = password;
  memcpy(local_82c,filename,(ulong)(uVar5 & 0xffff));
  iVar4 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
  if (0 < iVar4) {
    uVar9 = 0;
    iVar12 = 0;
    do {
      ec_clearmbx((ec_mbxbuft *)&local_438);
      iVar4 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_438,timeout);
      uVar2 = local_430;
      if (iVar4 < 1) {
        return iVar4;
      }
      iVar4 = -3;
      if ((local_433 & 0xf) != 4) {
LAB_00109d25:
        *psize = iVar12;
        return iVar4;
      }
      if (local_432 != '\x03') {
        if (local_432 == '\x05') {
          iVar4 = -5;
        }
        goto LAB_00109d25;
      }
      iVar4 = -6;
      if (local_430 != uVar9 + 1) goto LAB_00109d25;
      uVar5 = local_438 - 6;
      uVar10 = uVar5 & 0xffff;
      iVar11 = iVar12 + uVar10;
      if (iVar1 < iVar11) goto LAB_00109d25;
      memcpy(p,local_42c,(ulong)uVar10);
      local_858 = (short)uVar8;
      local_838 = 6;
      local_834 = '\0';
      uVar3 = ec_nextmbxcnt(context->slavelist[uVar7].mbx_cnt);
      context->slavelist[uVar7].mbx_cnt = uVar3;
      local_833 = uVar3 << 4 | 4;
      local_832 = '\x04';
      local_830 = uVar2;
      iVar4 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
      if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
        (*context->FOEhook)(slave,uVar2,iVar11);
      }
      p = (void *)((long)p + (ulong)uVar10);
      *psize = iVar11;
      uVar9 = uVar2;
      iVar12 = iVar11;
    } while (0 < iVar4 && (short)uVar5 == local_858);
  }
  return iVar4;
}

Assistant:

int ecx_FOEread(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int *psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 dataread = 0;
   int32 buffersize, packetnumber, prevpacket = 0;
   uint16 fnsize, maxdata, segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo;

   buffersize = *psize;
   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_READ;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               if(aFOEp->OpCode == ECT_FOE_DATA)
               {
                  segmentdata = etohs(aFOEp->MbxHeader.length) - 0x0006;
                  packetnumber = etohl(aFOEp->PacketNumber);
                  if ((packetnumber == ++prevpacket) && (dataread + segmentdata <= buffersize))
                  {
                     memcpy(p, &aFOEp->Data[0], segmentdata);
                     dataread += segmentdata;
                     p = (uint8 *)p + segmentdata;
                     if (segmentdata == maxdata)
                     {
                        worktodo = TRUE; 
                     }
                     FOEp->MbxHeader.length = htoes(0x0006);
                     FOEp->MbxHeader.address = htoes(0x0000);
                     FOEp->MbxHeader.priority = 0x00;
                     /* get new mailbox count value */
                     cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                     context->slavelist[slave].mbx_cnt = cnt;
                     FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                     FOEp->OpCode = ECT_FOE_ACK;
                     FOEp->PacketNumber = htoel(packetnumber);
                     /* send FoE ack to slave */
                     wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                     if (wkc <= 0)
                     {   
                        worktodo = FALSE;
                     }
                     if (context->FOEhook)
                     {
                        context->FOEhook(slave, packetnumber, dataread);
                     }
                  }
                  else
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_BUF2SMALL;
                  }
               }
               else
               {
                  if(aFOEp->OpCode == ECT_FOE_ERROR)
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                  }
                  else
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
            *psize = dataread;
         }
      } while (worktodo);   
   }
   
   return wkc;
}